

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

Color ftxui::Color::HSV(uint8_t h,uint8_t s,uint8_t v)

{
  Color CVar1;
  undefined8 in_RAX;
  undefined7 in_register_00000031;
  Color local_4;
  
  local_4 = SUB84((ulong)in_RAX >> 0x20,0);
  if ((int)CONCAT71(in_register_00000031,s) != 0) {
    CVar1 = (Color)(*(code *)(&DAT_0014aacc + *(int *)(&DAT_0014aacc + (ulong)(h / 0x2b) * 4)))
                             ((((uint)(h % 0x2b) * 6 & 0xff) * (uint)s >> 8 ^ 0xff) * (uint)v >> 8,
                              &DAT_0014aacc + *(int *)(&DAT_0014aacc + (ulong)(h / 0x2b) * 4),
                              &DAT_0014aacc,v,(s ^ 0xff) * (uint)v >> 8);
    return CVar1;
  }
  Color(&local_4,v,v,v);
  return local_4;
}

Assistant:

Color Color::HSV(uint8_t h, uint8_t s, uint8_t v) {
  if (s == 0)
    return Color(v, v, v);

  uint8_t region = h / 43;
  uint8_t remainder = (h - (region * 43)) * 6;
  uint8_t p = (v * (255 - s)) >> 8;
  uint8_t q = (v * (255 - ((s * remainder) >> 8))) >> 8;
  uint8_t t = (v * (255 - ((s * (255 - remainder)) >> 8))) >> 8;

  // clang-format off
  switch (region) {
    case 0: return Color(v,t,p);
    case 1: return Color(q,v,p);
    case 2: return Color(p,v,t);
    case 3: return Color(p,q,v);
    case 4: return Color(t,p,v);
    case 5: return Color(v,p,q);
  }
  // clang-format on

  return Color(0, 0, 0);
}